

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XML256TableTranscoder.cpp
# Opt level: O2

XMLByte __thiscall
xercesc_4_0::XML256TableTranscoder::xlatOneTo(XML256TableTranscoder *this,XMLCh toXlat)

{
  TransRec *pTVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  pTVar1 = this->fToTable;
  uVar2 = this->fToSize - 1;
  uVar3 = 0;
  do {
    uVar5 = (uVar2 - uVar3 >> 1) + uVar3;
    uVar4 = uVar5;
    if (((ushort)toXlat <= (ushort)pTVar1[uVar5].intCh) &&
       (uVar2 = uVar5, uVar4 = uVar3, (ushort)pTVar1[uVar5].intCh <= (ushort)toXlat))
    goto LAB_0025f8e0;
    uVar3 = uVar4;
  } while (uVar4 + 1 < uVar2);
  if (pTVar1[uVar2].intCh != toXlat) {
    return '\0';
  }
LAB_0025f8e0:
  return pTVar1[uVar2].extCh;
}

Assistant:

XMLByte XML256TableTranscoder::xlatOneTo(const XMLCh toXlat) const
{
    XMLSize_t lowOfs = 0;
    XMLSize_t hiOfs = fToSize - 1;
    do
    {
        // Calc the mid point of the low and high offset.
        const XMLSize_t midOfs = ((hiOfs - lowOfs) / 2) + lowOfs;

        //
        //  If our test char is greater than the mid point char, then
        //  we move up to the upper half. Else we move to the lower
        //  half. If its equal, then its our guy.
        //
        if (toXlat > fToTable[midOfs].intCh)
        {
            lowOfs = midOfs;
        }
         else if (toXlat < fToTable[midOfs].intCh)
        {
            hiOfs = midOfs;
        }
         else
        {
            return fToTable[midOfs].extCh;
        }
    }   while (lowOfs + 1 < hiOfs);

    // Check the high end of the range otherwise the
    // last item in the table may never be found.
        if (toXlat == fToTable[hiOfs].intCh)
        {
            return fToTable[hiOfs].extCh;
        }

    return 0;
}